

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmllint.c
# Opt level: O0

void endElementNsDebug(void *ctx,xmlChar *localname,xmlChar *prefix,xmlChar *URI)

{
  xmlChar *URI_local;
  xmlChar *prefix_local;
  xmlChar *localname_local;
  void *ctx_local;
  
  callbacks = callbacks + 1;
  if (noout == 0) {
    fprintf(_stdout,"SAX.endElementNs(%s",localname);
    if (prefix == (xmlChar *)0x0) {
      fprintf(_stdout,", NULL");
    }
    else {
      fprintf(_stdout,", %s",prefix);
    }
    if (URI == (xmlChar *)0x0) {
      fprintf(_stdout,", NULL)\n");
    }
    else {
      fprintf(_stdout,", \'%s\')\n",URI);
    }
  }
  return;
}

Assistant:

static void
endElementNsDebug(void *ctx ATTRIBUTE_UNUSED,
                  const xmlChar *localname,
                  const xmlChar *prefix,
                  const xmlChar *URI)
{
    callbacks++;
    if (noout)
	return;
    fprintf(stdout, "SAX.endElementNs(%s", (char *) localname);
    if (prefix == NULL)
	fprintf(stdout, ", NULL");
    else
	fprintf(stdout, ", %s", (char *) prefix);
    if (URI == NULL)
	fprintf(stdout, ", NULL)\n");
    else
	fprintf(stdout, ", '%s')\n", (char *) URI);
}